

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

void __thiscall
std::
vector<std::pair<Centaurus::CharClass<unsigned_char>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,std::set<int,std::less<int>,std::allocator<int>>>>>
::
emplace_back<Centaurus::CharClass<unsigned_char>,std::set<int,std::less<int>,std::allocator<int>>const&>
          (vector<std::pair<Centaurus::CharClass<unsigned_char>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,std::set<int,std::less<int>,std::allocator<int>>>>>
           *this,CharClass<unsigned_char> *__args,
          set<int,_std::less<int>,_std::allocator<int>_> *__args_1)

{
  iterator __position;
  
  __position._M_current =
       *(pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
         **)(this + 8);
  if (__position._M_current !=
      *(pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
        **)(this + 0x10)) {
    pair<Centaurus::CharClass<unsigned_char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
    ::pair<Centaurus::CharClass<unsigned_char>,_true>(__position._M_current,__args,__args_1);
    *(long *)(this + 8) = *(long *)(this + 8) + 0x50;
    return;
  }
  _M_realloc_insert<Centaurus::CharClass<unsigned_char>,std::set<int,std::less<int>,std::allocator<int>>const&>
            (this,__position,__args,__args_1);
  return;
}

Assistant:

CharClass(const Range<TCHAR>& r)
    {
        m_ranges.push_back(r);
    }